

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MruDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
::MruListEntry::MruListEntry(MruListEntry *this,RegexKey *key,RegexPattern **value)

{
  RegexPattern *pRVar1;
  char16_t *pcVar2;
  
  (this->
  super_DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
  ).previous.ptr = (MruListEntry *)0x0;
  (this->
  super_DoublyLinkedListElement<JsUtil::MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>::MruListEntry,_Memory::Recycler>
  ).next.ptr = (MruListEntry *)0x0;
  pRVar1 = *value;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = pRVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  pcVar2 = (key->source).ptr;
  Memory::Recycler::WBSetBit((char *)&this->key);
  (this->key).source.ptr = pcVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->key);
  (this->key).length = key->length;
  (this->key).flags = key->flags;
  this->dictionaryDataIndex = 0;
  return;
}

Assistant:

MruListEntry(const TKey &key, const TValue &value) : key(key), value(value), dictionaryDataIndex(0)
            {
            }